

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrib.c
# Opt level: O2

int newhp(void)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  if (u.ulevel == 0) {
    iVar2 = (int)urace.hpadv.infix + (int)urole.hpadv.infix;
    if ('\0' < urole.hpadv.inrnd) {
      iVar4 = rnd((int)urole.hpadv.inrnd);
      iVar2 = iVar2 + iVar4;
    }
    if ('\0' < urace.hpadv.inrnd) {
      iVar4 = rnd((int)urace.hpadv.inrnd);
      iVar2 = iVar2 + iVar4;
    }
    u.ualign.type = aligns[u.initalign].value;
    u.ualign.record = (int)urole.initrecord;
  }
  else {
    if (u.ulevel < urole.xlev) {
      iVar4 = (int)urace.hpadv.lofix + (int)urole.hpadv.lofix;
      bVar1 = urace.hpadv.lornd;
      if ('\0' < urole.hpadv.lornd) {
        iVar2 = rnd((int)urole.hpadv.lornd);
        iVar4 = iVar4 + iVar2;
        bVar1 = urace.hpadv.lornd;
      }
    }
    else {
      iVar4 = (int)urace.hpadv.hifix + (int)urole.hpadv.hifix;
      bVar1 = urace.hpadv.hirnd;
      if ('\0' < urole.hpadv.hirnd) {
        iVar2 = rnd((int)urole.hpadv.hirnd);
        iVar4 = iVar4 + iVar2;
        bVar1 = urace.hpadv.hirnd;
      }
    }
    if ('\0' < (char)bVar1) {
      iVar2 = rnd((uint)bVar1);
      iVar4 = iVar4 + iVar2;
    }
    bVar1 = acurr(4);
    if ((char)bVar1 < '\x04') {
      iVar3 = -2;
    }
    else if (bVar1 < 7) {
      iVar3 = -1;
    }
    else {
      iVar3 = 0;
      if ((0xe < bVar1) && (iVar3 = 1, 0x10 < bVar1)) {
        if (bVar1 == 0x11) {
          iVar3 = 2;
        }
        else {
          iVar3 = (bVar1 != 0x12) + 3;
        }
      }
    }
    iVar2 = 1;
    if (1 < iVar3 + iVar4) {
      iVar2 = iVar3 + iVar4;
    }
  }
  return iVar2;
}

Assistant:

int newhp(void)
{
	int	hp, conplus;


	if (u.ulevel == 0) {
	    /* Initialize hit points */
	    hp = urole.hpadv.infix + urace.hpadv.infix;
	    if (urole.hpadv.inrnd > 0) hp += rnd(urole.hpadv.inrnd);
	    if (urace.hpadv.inrnd > 0) hp += rnd(urace.hpadv.inrnd);

	    /* Initialize alignment stuff */
	    u.ualign.type = aligns[u.initalign].value;
	    u.ualign.record = urole.initrecord;

		return hp;
	} else {
	    if (u.ulevel < urole.xlev) {
	    	hp = urole.hpadv.lofix + urace.hpadv.lofix;
	    	if (urole.hpadv.lornd > 0) hp += rnd(urole.hpadv.lornd);
	    	if (urace.hpadv.lornd > 0) hp += rnd(urace.hpadv.lornd);
	    } else {
	    	hp = urole.hpadv.hifix + urace.hpadv.hifix;
	    	if (urole.hpadv.hirnd > 0) hp += rnd(urole.hpadv.hirnd);
	    	if (urace.hpadv.hirnd > 0) hp += rnd(urace.hpadv.hirnd);
	    }
	}

	if (ACURR(A_CON) <= 3) conplus = -2;
	else if (ACURR(A_CON) <= 6) conplus = -1;
	else if (ACURR(A_CON) <= 14) conplus = 0;
	else if (ACURR(A_CON) <= 16) conplus = 1;
	else if (ACURR(A_CON) == 17) conplus = 2;
	else if (ACURR(A_CON) == 18) conplus = 3;
	else conplus = 4;
	
	hp += conplus;
	return (hp <= 0) ? 1 : hp;
}